

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

bool __thiscall soul::Value::isZero(Value *this)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  PackedData local_28;
  
  bVar3 = true;
  if (((this->type).category != invalid) && ((this->allocatedData).allocatedData.numActive != 0)) {
    getData(&local_28,this);
    if (((local_28.type)->primitiveType).type != void_) {
      bVar3 = local_28.size == 0;
      if (!bVar3) {
        if (*local_28.data == '\0') {
          uVar1 = 1;
          do {
            uVar2 = uVar1;
            if (local_28.size == uVar2) break;
            uVar1 = uVar2 + 1;
          } while (local_28.data[uVar2] == '\0');
          bVar3 = local_28.size <= uVar2;
        }
        else {
          bVar3 = false;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

StringDictionary::Handle getStringLiteral() const
    {
        SOUL_ASSERT (type.isStringLiteral());
        return getAs<StringDictionary::Handle>();
    }